

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O3

t_pool_result * t_pool_next_result_locked(t_results_queue *q)

{
  int iVar1;
  t_results_queue *ptVar2;
  t_results_queue *ptVar3;
  t_results_queue *ptVar4;
  
  ptVar2 = q;
  ptVar4 = (t_results_queue *)0x0;
  do {
    ptVar3 = ptVar4;
    ptVar2 = (t_results_queue *)ptVar2->result_head;
    if (ptVar2 == (t_results_queue *)0x0) {
      return (t_pool_result *)ptVar2;
    }
    iVar1 = *(int *)&ptVar2->result_tail;
    ptVar4 = ptVar2;
  } while (iVar1 != q->next_serial);
  ptVar4 = ptVar3;
  if ((t_results_queue *)q->result_head == ptVar2) {
    ptVar4 = q;
  }
  ptVar4->result_head = ptVar2->result_head;
  if ((t_results_queue *)q->result_tail == ptVar2) {
    q->result_tail = (t_pool_result *)ptVar3;
  }
  if (q->result_head == (t_pool_result *)0x0) {
    q->result_tail = (t_pool_result *)0x0;
  }
  q->next_serial = iVar1 + 1;
  q->queue_len = q->queue_len + -1;
  return (t_pool_result *)ptVar2;
}

Assistant:

static t_pool_result *t_pool_next_result_locked(t_results_queue *q) {
    t_pool_result *r, *last;

    for (last = NULL, r = q->result_head; r; last = r, r = r->next) {
	if (r->serial == q->next_serial)
	    break;
    }

    if (r) {
	if (q->result_head == r)
	    q->result_head = r->next;
	else
	    last->next = r->next;

	if (q->result_tail == r)
	    q->result_tail = last;

	if (!q->result_head)
	    q->result_tail = NULL;

	q->next_serial++;
	q->queue_len--;
    }

    return r;
}